

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O3

void UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uint uVar1;
  char cVar2;
  ushort uVar3;
  short sVar4;
  ISCIILang IVar5;
  UChar *pUVar6;
  byte *pbVar7;
  void *pvVar8;
  UChar *pUVar9;
  long lVar10;
  UErrorCode UVar11;
  byte bVar12;
  UConverter *pUVar13;
  uint uVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint16_t uVar17;
  int iVar18;
  UChar *pUVar19;
  long lVar20;
  UChar *pUVar21;
  int32_t iVar22;
  int32_t *piVar23;
  byte bVar24;
  uint uVar25;
  int iVar26;
  bool bVar27;
  uint local_3c;
  uint local_34;
  
  pUVar13 = args->converter;
  pUVar21 = args->source;
  pUVar6 = args->sourceLimit;
  pbVar15 = (byte *)args->target;
  pbVar7 = (byte *)args->targetLimit;
  if ((pUVar6 < pUVar21 || pbVar7 < pbVar15) || pUVar13 == (UConverter *)0x0) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  uVar25 = pUVar13->fromUChar32;
  if (uVar25 == 0) {
    if (pUVar21 < pUVar6) {
      piVar23 = args->offsets;
      pvVar8 = pUVar13->extraInfo;
      local_34 = (uint)(*(ushort *)((long)pvVar8 + 6) >> 7);
      pbVar16 = pbVar15;
LAB_002bfbba:
      pUVar19 = pUVar21;
      pbVar15 = pbVar16;
      lVar10 = 0;
      do {
        lVar20 = lVar10;
        pUVar13 = args->converter;
        pbVar16 = pbVar15;
        if (pUVar13->fromUnicodeStatus == 10) {
          IVar5 = lookupInitialData[(ushort)local_34].isciiLang;
          pUVar13->fromUnicodeStatus = 0;
          pUVar21 = (UChar *)(lVar20 + (long)pUVar19);
          bVar12 = (byte)IVar5;
          if (pbVar7 <= pbVar15) {
            cVar2 = pUVar13->charErrorBufferLength;
            pUVar13->charErrorBufferLength = cVar2 + '\x01';
            pUVar13->charErrorBuffer[cVar2] = 0xef;
            pUVar13 = args->converter;
            cVar2 = pUVar13->charErrorBufferLength;
            pUVar13->charErrorBufferLength = cVar2 + '\x01';
            pUVar13->charErrorBuffer[cVar2] = bVar12;
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
          }
          pUVar9 = args->source;
          pbVar16 = pbVar15 + 1;
          *pbVar15 = 0xef;
          if (piVar23 == (int32_t *)0x0) {
            if (pbVar7 <= pbVar16) goto LAB_002c01bb;
            *pbVar16 = bVar12;
            piVar23 = (int32_t *)0x0;
          }
          else {
            iVar26 = (int)((ulong)((long)pUVar21 - (long)pUVar9) >> 1) + -1;
            *piVar23 = iVar26;
            if (pbVar7 <= pbVar16) {
LAB_002c01bb:
              pUVar13 = args->converter;
              cVar2 = pUVar13->charErrorBufferLength;
              pUVar13->charErrorBufferLength = cVar2 + '\x01';
              pUVar13->charErrorBuffer[cVar2] = bVar12;
              pbVar15 = pbVar16;
              goto LAB_002c01cf;
            }
            *pbVar16 = bVar12;
            piVar23[1] = iVar26;
            piVar23 = piVar23 + 2;
          }
          pbVar15 = pbVar15 + 2;
          pbVar16 = pbVar15;
          if (U_ZERO_ERROR < *err) break;
        }
        uVar3 = *(ushort *)((long)pUVar19 + lVar20);
        uVar25 = (uint)uVar3;
        if (uVar25 < 0xa1) {
          pUVar13 = args->converter;
          pUVar13->fromUnicodeStatus = uVar25;
          if (pbVar7 <= pbVar16) {
            cVar2 = pUVar13->charErrorBufferLength;
            pUVar13->charErrorBufferLength = cVar2 + '\x01';
            pUVar13->charErrorBuffer[cVar2] = (byte)uVar3;
            pbVar15 = pbVar16;
            goto LAB_002c01e9;
          }
          pUVar21 = args->source;
          *pbVar16 = (byte)uVar3;
          if (piVar23 == (int32_t *)0x0) {
            piVar23 = (int32_t *)0x0;
          }
          else {
            *piVar23 = (int)((ulong)((long)pUVar19 + (lVar20 - (long)pUVar21) + 2) >> 1) + -1;
            piVar23 = piVar23 + 1;
          }
          pbVar16 = pbVar16 + 1;
          pbVar15 = pbVar16;
          if (U_ZERO_ERROR < *err) goto LAB_002c01ef;
        }
        else {
          sVar4 = *(short *)((long)pvVar8 + 2);
          if (uVar25 != 0x200c) {
            if (uVar25 == 0x200d) {
              local_3c = (uint)(sVar4 != 0) * 0x10 + 0xd9;
              *(undefined2 *)((long)pvVar8 + 2) = 0;
              uVar25 = 0x200d;
              goto LAB_002bfe63;
            }
            uVar1 = uVar25 - 0x900;
            local_3c = 0xffff;
            if ((uVar1 & 0xffff) < 0x480) {
              if ((ushort)(uVar3 - 0x966) < 0xfffe) {
                uVar14 = uVar25 - 0x881;
                if (-1 < (int)uVar1) {
                  uVar14 = uVar1;
                }
                local_34 = (int)uVar14 >> 7;
                uVar14 = uVar14 & 0xff80;
                if (((short)uVar14 == *(short *)((long)pvVar8 + 6)) &&
                   (*(char *)((long)pvVar8 + 0x18) == '\0')) {
                  bVar27 = true;
                }
                else {
                  *(short *)((long)pvVar8 + 6) = (short)uVar14;
                  *(MaskEnum *)((long)pvVar8 + 0xc) = lookupInitialData[(ushort)local_34].maskEnum;
                  *(undefined1 *)((long)pvVar8 + 0x18) = 0;
                  bVar27 = false;
                }
                if (uVar14 == 0x100) {
                  if (uVar25 == 0xa70) {
                    uVar25 = 0xa02;
                  }
                  else if (uVar25 == 0xa71) {
                    *(undefined2 *)((long)pvVar8 + 2) = 0xa71;
                    uVar25 = 0xa71;
                  }
                }
                uVar25 = uVar25 - uVar14;
              }
              else {
                bVar27 = true;
              }
              uVar17 = fromUnicodeTable[uVar25 & 0xff];
              if ((*(uint *)((long)pvVar8 + 0xc) & (uint)""[uVar25 & 0xff]) == 0) {
                if (*(short *)((long)pvVar8 + 6) != 0x300) {
                  uVar17 = 0xffff;
                }
                if (uVar25 != 0x931) {
                  uVar17 = 0xffff;
                }
              }
              if (!bVar27) {
                local_3c = (uint)uVar17;
                bVar12 = (byte)lookupInitialData[(ushort)local_34].isciiLang;
                if (pbVar7 <= pbVar16) {
                  pUVar13 = args->converter;
                  cVar2 = pUVar13->charErrorBufferLength;
                  pUVar13->charErrorBufferLength = cVar2 + '\x01';
                  pUVar13->charErrorBuffer[cVar2] = 0xef;
                  pUVar13 = args->converter;
                  cVar2 = pUVar13->charErrorBufferLength;
                  pUVar13->charErrorBufferLength = cVar2 + '\x01';
                  pUVar13->charErrorBuffer[cVar2] = bVar12;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                  goto LAB_002bfe63;
                }
                pUVar21 = args->source;
                pbVar15 = pbVar16 + 1;
                *pbVar16 = 0xef;
                if (piVar23 == (int32_t *)0x0) {
                  if (pbVar7 <= pbVar15) {
                    piVar23 = (int32_t *)0x0;
                    goto LAB_002c0169;
                  }
                  *pbVar15 = bVar12;
                  piVar23 = (int32_t *)0x0;
                }
                else {
                  iVar26 = (int)((ulong)((long)pUVar19 + (lVar20 - (long)pUVar21) + 2) >> 1) + -1;
                  *piVar23 = iVar26;
                  if (pbVar7 <= pbVar15) {
                    piVar23 = piVar23 + 1;
LAB_002c0169:
                    pUVar13 = args->converter;
                    cVar2 = pUVar13->charErrorBufferLength;
                    pUVar13->charErrorBufferLength = cVar2 + '\x01';
                    pUVar13->charErrorBuffer[cVar2] = bVar12;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                    pbVar16 = pbVar15;
                    goto LAB_002bfe63;
                  }
                  *pbVar15 = bVar12;
                  piVar23[1] = iVar26;
                  piVar23 = piVar23 + 2;
                }
                pbVar16 = pbVar16 + 2;
                if (U_ZERO_ERROR < *err) goto LAB_002bfe63;
              }
              local_3c = (uint)uVar17;
              if ((uVar25 == 0x971) && (*(short *)((long)pvVar8 + 6) == 0x100)) goto LAB_002c00db;
            }
            *(undefined2 *)((long)pvVar8 + 2) = 0;
            goto LAB_002bfe63;
          }
          if (sVar4 != 0) goto LAB_002bfdb6;
        }
        pbVar15 = pbVar16;
        lVar10 = lVar20 + 2;
        if (pUVar6 <= (UChar *)((long)pUVar19 + lVar20 + 2)) goto LAB_002c01ef;
      } while( true );
    }
  }
  else {
LAB_002bfb4f:
    UVar11 = U_ZERO_ERROR;
    pbVar16 = pbVar15;
    if (pUVar21 < pUVar6) {
      bVar27 = ((ushort)*pUVar21 & 0xfc00) == 0xdc00;
      UVar11 = !bVar27 + 10 + (uint)!bVar27;
      uVar1 = uVar25 * 0x400 + (uint)(ushort)*pUVar21 + 0xfca02400;
      if (!bVar27) {
        uVar1 = uVar25;
      }
      uVar25 = uVar1;
      pUVar21 = pUVar21 + bVar27;
    }
LAB_002bfb8e:
    *err = UVar11;
    args->converter->fromUChar32 = uVar25;
    pbVar15 = pbVar16;
  }
LAB_002c01fa:
  args->source = pUVar21;
  args->target = (char *)pbVar15;
  return;
LAB_002bfdb6:
  *(undefined2 *)((long)pvVar8 + 2) = 0;
  uVar25 = 0x200c;
  local_3c = 0xe8;
LAB_002bfe63:
  bVar24 = (byte)local_3c;
  bVar12 = (byte)(local_3c >> 8);
  pbVar15 = pbVar16;
  if ((((*(short *)((long)pvVar8 + 6) != 0x100) || (sVar4 != 0xa71)) ||
      (uVar25 - 0x950 < 0xffffffb0)) || ((""[uVar25 - 0x900] & 1) == 0)) {
    if (local_3c == 0xe8) {
      *(undefined2 *)((long)pvVar8 + 2) = 0xe8;
      if (pbVar7 <= pbVar16) goto LAB_002c0269;
      iVar22 = (int)((ulong)((long)pUVar19 + (lVar20 - (long)args->source) + 2) >> 1) + -1;
LAB_002bff45:
      *pbVar16 = bVar24;
      pbVar16 = pbVar16 + 1;
      if (piVar23 == (int32_t *)0x0) {
LAB_002c007f:
        piVar23 = (int32_t *)0x0;
      }
      else {
        *piVar23 = iVar22;
        piVar23 = piVar23 + 1;
      }
    }
    else {
      if (local_3c == 0xffff) {
        pUVar21 = (UChar *)((long)pUVar19 + lVar20 + 2);
        UVar11 = U_INVALID_CHAR_FOUND;
        if (((uVar25 & 0xfffff800) != 0xd800) ||
           (UVar11 = U_ILLEGAL_CHAR_FOUND, (uVar25 >> 10 & 1) != 0)) goto LAB_002bfb8e;
        goto LAB_002bfb4f;
      }
      if (pbVar7 <= pbVar16) {
        if ((local_3c & 0xff00) != 0) {
          pUVar13 = args->converter;
          cVar2 = pUVar13->charErrorBufferLength;
          pUVar13->charErrorBufferLength = cVar2 + '\x01';
          pUVar13->charErrorBuffer[cVar2] = bVar12;
        }
        goto LAB_002c0269;
      }
      iVar22 = (int)((ulong)((long)pUVar19 + (lVar20 - (long)args->source) + 2) >> 1) + -1;
      if (local_3c < 0x100) goto LAB_002bff45;
      pbVar15 = pbVar16 + 1;
      *pbVar16 = bVar12;
      if (piVar23 == (int32_t *)0x0) {
        if (pbVar7 <= pbVar15) goto LAB_002c032c;
        pbVar16[1] = bVar24;
        pbVar16 = pbVar16 + 2;
        goto LAB_002c007f;
      }
      *piVar23 = iVar22;
      if (pbVar7 <= pbVar15) {
LAB_002c032c:
        pUVar13 = args->converter;
        cVar2 = pUVar13->charErrorBufferLength;
        pUVar13->charErrorBufferLength = cVar2 + '\x01';
        pUVar13->charErrorBuffer[cVar2] = bVar24;
        *err = U_BUFFER_OVERFLOW_ERROR;
        pUVar21 = (UChar *)((long)pUVar19 + lVar20 + 2);
        goto LAB_002c01fa;
      }
      pbVar16[1] = bVar24;
      pbVar16 = pbVar16 + 2;
      piVar23[1] = iVar22;
      piVar23 = piVar23 + 2;
    }
    UVar11 = *err;
    goto joined_r0x002c0088;
  }
  *(undefined2 *)((long)pvVar8 + 2) = 0;
  bVar12 = bVar12 | 0xe8;
  if (pbVar7 <= pbVar16) {
    pUVar13 = args->converter;
    if ((local_3c << 0x10 & 0xff0000) != 0) {
      cVar2 = pUVar13->charErrorBufferLength;
      pUVar13->charErrorBufferLength = cVar2 + '\x01';
      pUVar13->charErrorBuffer[cVar2] = bVar24;
      pUVar13 = args->converter;
    }
    pUVar21 = (UChar *)((long)pUVar19 + lVar20 + 2);
    cVar2 = pUVar13->charErrorBufferLength;
    pUVar13->charErrorBufferLength = cVar2 + '\x01';
    pUVar13->charErrorBuffer[cVar2] = bVar12;
    pUVar13 = args->converter;
    cVar2 = pUVar13->charErrorBufferLength;
    pUVar13->charErrorBufferLength = cVar2 + '\x01';
    pUVar13->charErrorBuffer[cVar2] = bVar24;
LAB_002c01cf:
    *err = U_BUFFER_OVERFLOW_ERROR;
    goto LAB_002c01fa;
  }
  iVar26 = (int)((ulong)((long)pUVar19 + (lVar20 - (long)args->source) + 2) >> 1);
  iVar18 = iVar26 + -1;
  if ((local_3c << 0x10 | local_3c) < 0x10000) {
LAB_002bffd9:
    if (pbVar7 <= pbVar15) {
LAB_002c02f4:
      pUVar13 = args->converter;
      cVar2 = pUVar13->charErrorBufferLength;
      pUVar13->charErrorBufferLength = cVar2 + '\x01';
      pUVar13->charErrorBuffer[cVar2] = bVar12;
      pUVar13 = args->converter;
      cVar2 = pUVar13->charErrorBufferLength;
      pUVar13->charErrorBufferLength = cVar2 + '\x01';
      pUVar13->charErrorBuffer[cVar2] = bVar24;
LAB_002c01e9:
      *err = U_BUFFER_OVERFLOW_ERROR;
LAB_002c01ef:
      pUVar21 = (UChar *)((long)pUVar19 + lVar20 + 2);
      goto LAB_002c01fa;
    }
    pbVar16 = pbVar15 + 1;
    *pbVar15 = bVar12;
    if (piVar23 == (int32_t *)0x0) {
      piVar23 = (int32_t *)0x0;
    }
    else {
      *piVar23 = iVar18;
      piVar23 = piVar23 + 1;
    }
  }
  else {
    pbVar15 = pbVar16 + 1;
    *pbVar16 = bVar24;
    if (piVar23 != (int32_t *)0x0) {
      iVar18 = iVar26 + -2;
      *piVar23 = iVar18;
      piVar23 = piVar23 + 1;
      goto LAB_002bffd9;
    }
    if (pbVar7 <= pbVar15) goto LAB_002c02f4;
    pbVar16[1] = bVar12;
    pbVar16 = pbVar16 + 2;
    piVar23 = (int32_t *)0x0;
  }
  if (pbVar7 <= pbVar16) {
LAB_002c0269:
    pUVar13 = args->converter;
    cVar2 = pUVar13->charErrorBufferLength;
    pUVar13->charErrorBufferLength = cVar2 + '\x01';
    pUVar13->charErrorBuffer[cVar2] = bVar24;
    *err = U_BUFFER_OVERFLOW_ERROR;
    goto LAB_002c028a;
  }
  *pbVar16 = bVar24;
  if (piVar23 == (int32_t *)0x0) {
    piVar23 = (int32_t *)0x0;
  }
  else {
    *piVar23 = iVar18;
    piVar23 = piVar23 + 1;
  }
  pbVar16 = pbVar15 + 2;
  UVar11 = *err;
joined_r0x002c0088:
  if (U_ZERO_ERROR < UVar11) goto LAB_002c028a;
LAB_002c00db:
  pUVar21 = (UChar *)((long)pUVar19 + lVar20 + 2);
  if (pUVar6 <= pUVar21) goto LAB_002c028a;
  goto LAB_002bfbba;
LAB_002c028a:
  pUVar21 = (UChar *)((long)pUVar19 + lVar20 + 2);
  pbVar15 = pbVar16;
  goto LAB_002c01fa;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISCII_OFFSETS_LOGIC(
        UConverterFromUnicodeArgs * args, UErrorCode * err) {
    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UChar32 tempContextFromUnicode = 0x0000;    /* For special handling of the Gurmukhi script. */
    UConverterDataISCII *converterData;
    uint16_t newDelta=0;
    uint16_t range = 0;
    UBool deltaChanged = FALSE;

    if ((args->converter == NULL) || (args->targetLimit < args->target) || (args->sourceLimit < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    /* initialize data */
    converterData=(UConverterDataISCII*)args->converter->extraInfo;
    newDelta=converterData->currentDeltaFromUnicode;
    range = (uint16_t)(newDelta/DELTA);

    if ((sourceChar = args->converter->fromUChar32)!=0) {
        goto getTrail;
    }

    /*writing the char to the output stream */
    while (source < sourceLimit) {
        /* Write the language code following LF only if LF is not the last character. */
        if (args->converter->fromUnicodeStatus == LF) {
            targetByteUnit = ATR<<8;
            targetByteUnit += (uint8_t) lookupInitialData[range].isciiLang;
            args->converter->fromUnicodeStatus = 0x0000;
            /* now append ATR and language code */
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        }
        
        sourceChar = *source++;
        tempContextFromUnicode = converterData->contextCharFromUnicode;
        
        targetByteUnit = missingCharMarker;
        
        /*check if input is in ASCII and C0 control codes range*/
        if (sourceChar <= ASCII_END) {
            args->converter->fromUnicodeStatus = sourceChar;
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,sourceChar,err);
            if (U_FAILURE(*err)) {
                break;
            }
            continue;
        }
        switch (sourceChar) {
        case ZWNJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                converterData->contextCharFromUnicode = 0x00;
                targetByteUnit = ISCII_HALANT;
            } else {
                /* consume ZWNJ and continue */
                converterData->contextCharFromUnicode = 0x00;
                continue;
            }
            break;
        case ZWJ:
            /* contextChar has HALANT */
            if (converterData->contextCharFromUnicode) {
                targetByteUnit = ISCII_NUKTA;
            } else {
                targetByteUnit =ISCII_INV;
            }
            converterData->contextCharFromUnicode = 0x00;
            break;
        default:
            /* is the sourceChar in the INDIC_RANGE? */
            if ((uint16_t)(INDIC_BLOCK_END-sourceChar) <= INDIC_RANGE) {
                /* Danda and Double Danda are valid in Northern scripts.. since Unicode
                 * does not include these codepoints in all Northern scrips we need to
                 * filter them out
                 */
                if (sourceChar!= DANDA && sourceChar != DOUBLE_DANDA) {
                    /* find out to which block the souceChar belongs*/
                    range =(uint16_t)((sourceChar-INDIC_BLOCK_BEGIN)/DELTA);
                    newDelta =(uint16_t)(range*DELTA);

                    /* Now are we in the same block as the previous? */
                    if (newDelta!= converterData->currentDeltaFromUnicode || converterData->isFirstBuffer) {
                        converterData->currentDeltaFromUnicode = newDelta;
                        converterData->currentMaskFromUnicode = lookupInitialData[range].maskEnum;
                        deltaChanged =TRUE;
                        converterData->isFirstBuffer=FALSE;
                    }
                    
                    if (converterData->currentDeltaFromUnicode == PNJ_DELTA) { 
                        if (sourceChar == PNJ_TIPPI) {
                            /* Make sure Tippi is converterd to Bindi. */
                            sourceChar = PNJ_BINDI;
                        } else if (sourceChar == PNJ_ADHAK) {
                            /* This is for consonant cluster handling. */
                            converterData->contextCharFromUnicode = PNJ_ADHAK;
                        }
                        
                    }
                    /* Normalize all Indic codepoints to Devanagari and map them to ISCII */
                    /* now subtract the new delta from sourceChar*/
                    sourceChar -= converterData->currentDeltaFromUnicode;
                }

                /* get the target byte unit */
                targetByteUnit=fromUnicodeTable[(uint8_t)sourceChar];

                /* is the code point valid in current script? */
                if ((validityTable[(uint8_t)sourceChar] & converterData->currentMaskFromUnicode)==0) {
                    /* Vocallic RR is assigned in ISCII Telugu and Unicode */
                    if (converterData->currentDeltaFromUnicode!=(TELUGU_DELTA) || sourceChar!=VOCALLIC_RR) {
                        targetByteUnit=missingCharMarker;
                    }
                }

                if (deltaChanged) {
                    /* we are in a script block which is different than
                     * previous sourceChar's script block write ATR and language codes
                     */
                    uint32_t temp=0;
                    temp =(uint16_t)(ATR<<8);
                    temp += (uint16_t)((uint8_t) lookupInitialData[range].isciiLang);
                    /* reset */
                    deltaChanged=FALSE;
                    /* now append ATR and language code */
                    WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,temp,err);
                    if (U_FAILURE(*err)) {
                        break;
                    }
                }
                
                if (converterData->currentDeltaFromUnicode == PNJ_DELTA && (sourceChar + PNJ_DELTA) == PNJ_ADHAK) {
                    continue;
                }
            }
            /* reset context char */
            converterData->contextCharFromUnicode = 0x00;
            break;
        }
        if (converterData->currentDeltaFromUnicode == PNJ_DELTA && tempContextFromUnicode == PNJ_ADHAK && isPNJConsonant((sourceChar + PNJ_DELTA))) {
            /* If the previous codepoint is Adhak and the current codepoint is a consonant, the targetByteUnit should be C + Halant + C. */
            /* reset context char */
            converterData->contextCharFromUnicode = 0x0000;
            targetByteUnit = targetByteUnit << 16 | ISCII_HALANT << 8 | targetByteUnit;
            /* write targetByteUnit to target */
            WRITE_TO_TARGET_FROM_U(args, offsets, source, target, targetLimit, targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else if (targetByteUnit != missingCharMarker) {
            if (targetByteUnit==ISCII_HALANT) {
                converterData->contextCharFromUnicode = (UChar)targetByteUnit;
            }
            /* write targetByteUnit to target*/
            WRITE_TO_TARGET_FROM_U(args,offsets,source,target,targetLimit,targetByteUnit,err);
            if (U_FAILURE(*err)) {
                break;
            }
        } else {
            /* oops.. the code point is unassigned */
            /*check if the char is a First surrogate*/
            if (U16_IS_SURROGATE(sourceChar)) {
                if (U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if (source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail= (*source);
                        if (U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            *err =U_INVALID_CHAR_FOUND;
                            /* convert this surrogate code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                        }
                    } else {
                        /* no more input */
                        *err = U_ZERO_ERROR;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                }
            } else {
                /* callback(unassigned) for a BMP code point */
                *err = U_INVALID_CHAR_FOUND;
            }

            args->converter->fromUChar32=sourceChar;
            break;
        }
    }/* end while(mySourceIndex<mySourceLength) */

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}